

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O0

void __thiscall iutest::detail::NoEffectFile::~NoEffectFile(NoEffectFile *this)

{
  NoEffectFile *this_local;
  
  ~NoEffectFile(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

class NoEffectFile IUTEST_CXX_FINAL : public IFile
{
public:
    virtual void Close() IUTEST_CXX_OVERRIDE {}
    virtual bool Write(const void*, size_t, size_t) IUTEST_CXX_OVERRIDE { return true;  }
    virtual bool Read(void*, size_t, size_t) IUTEST_CXX_OVERRIDE { return true; }
    virtual iu_uint_max_t GetSize() IUTEST_CXX_OVERRIDE { return 0; }
private:
    virtual bool OpenImpl(const char*, int) IUTEST_CXX_OVERRIDE { return true; }
};

}